

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

wchar_t tree_current_is_dir(tree *t)

{
  wchar_t wVar1;
  stat *psVar2;
  uint uVar3;
  
  if ((t->flags & 0x20) != 0) {
    psVar2 = tree_current_lstat(t);
    if (psVar2 == (stat *)0x0) {
      return L'\0';
    }
    uVar3 = psVar2->st_mode & 0xf000;
    if ((short)uVar3 == 0x4000) {
      return L'\x01';
    }
    if (uVar3 != 0xa000) {
      return L'\0';
    }
  }
  psVar2 = tree_current_stat(t);
  if (psVar2 == (stat *)0x0) {
    wVar1 = L'\0';
  }
  else {
    wVar1 = (wchar_t)((psVar2->st_mode & 0xf000) == 0x4000);
  }
  return wVar1;
}

Assistant:

static int
tree_current_is_dir(struct tree *t)
{
	const struct stat *st;
	/*
	 * If we already have lstat() info, then try some
	 * cheap tests to determine if this is a dir.
	 */
	if (t->flags & hasLstat) {
		/* If lstat() says it's a dir, it must be a dir. */
		st = tree_current_lstat(t);
		if (st == NULL)
			return 0;
		if (S_ISDIR(st->st_mode))
			return 1;
		/* Not a dir; might be a link to a dir. */
		/* If it's not a link, then it's not a link to a dir. */
		if (!S_ISLNK(st->st_mode))
			return 0;
		/*
		 * It's a link, but we don't know what it's a link to,
		 * so we'll have to use stat().
		 */
	}

	st = tree_current_stat(t);
	/* If we can't stat it, it's not a dir. */
	if (st == NULL)
		return 0;
	/* Use the definitive test.  Hopefully this is cached. */
	return (S_ISDIR(st->st_mode));
}